

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestReadCustomFilesCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestReadCustomFilesCommand::InitialPass
          (cmCTestReadCustomFilesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  const_iterator __begin1;
  pointer dir;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  dir = pbVar1;
  if (pbVar1 == pbVar2) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"called with incorrect number of arguments","");
    cmCommand::SetError((cmCommand *)this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    do {
      cmCTest::ReadCustomConfigurationFileTree
                ((this->super_cmCTestCommand).CTest,dir,
                 (this->super_cmCTestCommand).super_cmCommand.Makefile);
      dir = dir + 1;
    } while (dir != pbVar2);
  }
  return pbVar1 != pbVar2;
}

Assistant:

bool cmCTestReadCustomFilesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  for (std::string const& arg : args) {
    this->CTest->ReadCustomConfigurationFileTree(arg, this->Makefile);
  }

  return true;
}